

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ExpressionResultBuilder * __thiscall
Catch::ExpressionResultBuilder::operator<<(ExpressionResultBuilder *this,char **value)

{
  char **value_local;
  ExpressionResultBuilder *this_local;
  
  std::operator<<((ostream *)&this->m_stream,*value);
  return this;
}

Assistant:

ExpressionResultBuilder& operator << ( const T& value ) {
        m_stream << value;
        return *this;
    }